

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::gripMoved(QColumnViewPrivate *this,int offset)

{
  bool bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QWidget *this_00;
  qsizetype qVar4;
  QWidget *pQVar5;
  reference piVar6;
  const_reference ppQVar7;
  QColumnViewPrivate *in_RDI;
  int currentX;
  int i;
  bool found;
  QObject *grip;
  QColumnView *q;
  qsizetype in_stack_ffffffffffffffa8;
  QAbstractItemView *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_28;
  QColumnViewPrivate *this_01;
  
  this_01 = in_RDI;
  q_func(in_RDI);
  pQVar3 = (QWidget *)QObject::sender();
  QWidget::isRightToLeft((QWidget *)0x861e3e);
  bVar1 = false;
  local_28 = 0;
  do {
    this_00 = (QWidget *)(long)local_28;
    qVar4 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
    if (qVar4 <= (long)this_00) {
      updateScrollbars(this_01);
      return;
    }
    if (bVar1) {
LAB_00861f60:
      if (bVar1) {
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                  );
        QWidget::x(this_00);
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                  );
        QWidget::move(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
    }
    else {
      QList<QAbstractItemView_*>::at
                ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      pQVar5 = QAbstractScrollArea::cornerWidget
                         (&in_stack_ffffffffffffffb0->super_QAbstractScrollArea);
      if (pQVar5 != pQVar3) goto LAB_00861f60;
      bVar1 = true;
      QList<QAbstractItemView_*>::at
                ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffbc = QWidget::width((QWidget *)0x861ee0);
      piVar6 = QList<int>::operator[]
                         ((QList<int> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      *piVar6 = in_stack_ffffffffffffffbc;
      bVar2 = QWidget::isRightToLeft((QWidget *)0x861f0a);
      if (bVar2) {
        ppQVar7 = QList<QAbstractItemView_*>::at
                            ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffb0 = *ppQVar7;
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                  );
        QWidget::x(this_00);
        QWidget::move(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void QColumnViewPrivate::gripMoved(int offset)
{
    Q_Q(QColumnView);

    QObject *grip = q->sender();
    Q_ASSERT(grip);

    if (q->isRightToLeft())
        offset = -1 * offset;

    bool found = false;
    for (int i = 0; i < columns.size(); ++i) {
        if (!found && columns.at(i)->cornerWidget() == grip) {
            found = true;
            columnSizes[i] = columns.at(i)->width();
            if (q->isRightToLeft())
                columns.at(i)->move(columns.at(i)->x() + offset, 0);
            continue;
        }
        if (!found)
            continue;

        int currentX = columns.at(i)->x();
        columns.at(i)->move(currentX + offset, 0);
    }

    updateScrollbars();
}